

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.h
# Opt level: O0

path * __thiscall filesystem::path::operator/=(path *this,path *p)

{
  bool bVar1;
  invalid_argument *this_00;
  char *pcVar2;
  string local_50 [48];
  string *local_20;
  path *p_local;
  path *this_local;
  
  local_20 = (string *)p;
  p_local = this;
  bVar1 = empty(p);
  if (!bVar1) {
    if ((string *)this == local_20) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"\'path\' self append not defined");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
    if (*pcVar2 == '/') {
      std::__cxx11::string::operator+=((string *)this,local_20);
    }
    else {
      std::operator+((char)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f);
      std::__cxx11::string::operator+=((string *)this,local_50);
      std::__cxx11::string::~string(local_50);
    }
  }
  return this;
}

Assistant:

path& operator/=(const path& p)
    {
        if (p.empty()) {
            return *this;
        }

        if (this == &p)  // self-append
        {
            throw std::invalid_argument("'path' self append not defined");
            /*path rhs(p);
            if (!detail::is_directory_separator(rhs.path_[0]))
                m_append_separator_if_needed();
            m_pathname += rhs.m_pathname;*/
        }
        else {
            /*if (!detail::is_directory_separator(*p.m_pathname.begin()))
                m_append_separator_if_needed();
            m_pathname += p.m_pathname;*/
            if (p.path_[0] != separator_) {
                this->path_ += (separator_ + p.path_);
            }
            else {
                this->path_ += p.path_;
            }
        }
        return *this;
    }